

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O1

char * ARM_group_name(csh handle,uint id)

{
  ulong uVar1;
  
  if (id - 2 < 0x7e || 0x9e < id) {
    return (char *)0x0;
  }
  uVar1 = (ulong)(id - 0x7e);
  if (id < 0x80) {
    uVar1 = (ulong)id;
  }
  return group_name_maps[uVar1].name;
}

Assistant:

const char *ARM_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	// verify group id
	if (id >= ARM_GRP_ENDING || (id > ARM_GRP_JUMP && id < ARM_GRP_CRYPTO))
		return NULL;

	// NOTE: when new generic groups are added, 2 must be changed accordingly
	if (id >= 128)
		return group_name_maps[id - 128 + 2].name;
	else
		return group_name_maps[id].name;
#else
	return NULL;
#endif
}